

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wav_file.cc
# Opt level: O0

rtc_WavWriter * rtc_WavOpen(char *filename,int sample_rate,size_t num_channels)

{
  char *pcVar1;
  WavWriter *this;
  allocator local_41;
  string local_40 [32];
  size_t local_20;
  size_t num_channels_local;
  char *pcStack_10;
  int sample_rate_local;
  char *filename_local;
  
  local_20 = num_channels;
  num_channels_local._4_4_ = sample_rate;
  pcStack_10 = filename;
  this = (WavWriter *)operator_new(0x28);
  pcVar1 = pcStack_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,pcVar1,&local_41);
  webrtc::WavWriter::WavWriter(this,(string *)local_40,num_channels_local._4_4_,local_20);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  return (rtc_WavWriter *)this;
}

Assistant:

rtc_WavWriter* rtc_WavOpen(const char* filename,
                           int sample_rate,
                           size_t num_channels) {
  return reinterpret_cast<rtc_WavWriter*>(
      new webrtc::WavWriter(filename, sample_rate, num_channels));
}